

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O1

void update_box(gdImagePtr oim,gdImagePtr nim,my_cquantize_ptr cquantize,boxptr boxp)

{
  uchar **ppuVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  short *psVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  uchar *puVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  
  ppuVar1 = oim->pixels;
  iVar15 = *(int *)&nim->pixels;
  iVar16 = *(int *)((long)&nim->pixels + 4);
  iVar4 = nim->sx;
  lVar6 = (long)iVar4;
  iVar9 = nim->sy;
  iVar11 = nim->colorsTotal;
  lVar12 = (long)iVar11;
  iVar10 = nim->red[0];
  if (iVar15 < iVar16) {
    lVar17 = (long)iVar15;
    do {
      if (iVar4 <= iVar9) {
        puVar14 = ppuVar1[lVar17] + lVar6 * 0x40 + lVar12 * 2;
        lVar8 = lVar6;
        do {
          if (iVar11 <= iVar10) {
            lVar18 = 0;
            do {
              if (*(short *)(puVar14 + lVar18 * 2) != 0) {
                iVar15 = (int)lVar17;
                *(int *)&nim->pixels = iVar15;
                goto LAB_00124152;
              }
              lVar18 = lVar18 + 1;
            } while ((iVar10 - iVar11) + 1 != (int)lVar18);
          }
          lVar8 = lVar8 + 1;
          puVar14 = puVar14 + 0x40;
        } while (iVar9 + 1 != (int)lVar8);
      }
      lVar17 = lVar17 + 1;
    } while (iVar16 + 1 != (int)lVar17);
  }
LAB_00124152:
  if (iVar15 < iVar16) {
    lVar17 = (long)iVar16;
    do {
      if (iVar4 <= iVar9) {
        puVar14 = ppuVar1[lVar17] + lVar6 * 0x40 + lVar12 * 2;
        lVar8 = lVar6;
        do {
          if (iVar11 <= iVar10) {
            lVar18 = 0;
            do {
              if (*(short *)(puVar14 + lVar18 * 2) != 0) {
                iVar16 = (int)lVar17;
                *(int *)((long)&nim->pixels + 4) = iVar16;
                goto LAB_001241db;
              }
              lVar18 = lVar18 + 1;
            } while ((iVar10 - iVar11) + 1 != (int)lVar18);
          }
          lVar8 = lVar8 + 1;
          puVar14 = puVar14 + 0x40;
        } while (iVar9 + 1 != (int)lVar8);
      }
      bVar2 = iVar15 < lVar17;
      lVar17 = lVar17 + -1;
    } while (bVar2);
  }
LAB_001241db:
  if (iVar4 < iVar9) {
    lVar17 = lVar6 * 0x40 + lVar12 * 2;
    do {
      lVar8 = (long)iVar15;
      if (iVar15 <= iVar16) {
        do {
          if (iVar11 <= iVar10) {
            lVar18 = 0;
            do {
              if (*(short *)(ppuVar1[lVar8] + lVar18 * 2 + lVar17) != 0) {
                iVar4 = (int)lVar6;
                nim->sx = iVar4;
                goto LAB_00124258;
              }
              lVar18 = lVar18 + 1;
            } while ((iVar10 - iVar11) + 1 != (int)lVar18);
          }
          lVar8 = lVar8 + 1;
        } while (iVar16 + 1 != (int)lVar8);
      }
      lVar6 = lVar6 + 1;
      lVar17 = lVar17 + 0x40;
    } while (iVar9 + 1 != (int)lVar6);
  }
LAB_00124258:
  if (iVar4 < iVar9) {
    lVar6 = (long)iVar9 * 0x40 + lVar12 * 2;
    lVar17 = (long)iVar9;
    do {
      lVar8 = (long)iVar15;
      if (iVar15 <= iVar16) {
        do {
          if (iVar11 <= iVar10) {
            lVar18 = 0;
            do {
              if (*(short *)(ppuVar1[lVar8] + lVar18 * 2 + lVar6) != 0) {
                iVar9 = (int)lVar17;
                nim->sy = iVar9;
                goto LAB_001242e2;
              }
              lVar18 = lVar18 + 1;
            } while ((iVar10 - iVar11) + 1 != (int)lVar18);
          }
          lVar8 = lVar8 + 1;
        } while (iVar16 + 1 != (int)lVar8);
      }
      lVar6 = lVar6 + -0x40;
      bVar2 = iVar4 < lVar17;
      lVar17 = lVar17 + -1;
    } while (bVar2);
  }
LAB_001242e2:
  if (iVar11 < iVar10) {
    do {
      lVar6 = (long)iVar15;
      if (iVar15 <= iVar16) {
        do {
          if (iVar4 <= iVar9) {
            psVar7 = (short *)(ppuVar1[lVar6] + lVar12 * 2 + (long)iVar4 * 0x40);
            iVar13 = (iVar9 - iVar4) + 1;
            do {
              if (*psVar7 != 0) {
                iVar11 = (int)lVar12;
                nim->colorsTotal = iVar11;
                goto LAB_00124359;
              }
              psVar7 = psVar7 + 0x20;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar6 = lVar6 + 1;
        } while (iVar16 + 1 != (int)lVar6);
      }
      lVar12 = lVar12 + 1;
    } while (iVar10 + 1 != (int)lVar12);
  }
LAB_00124359:
  if (iVar11 < iVar10) {
    lVar6 = (long)iVar10;
    do {
      lVar12 = (long)iVar15;
      if (iVar15 <= iVar16) {
        do {
          if (iVar4 <= iVar9) {
            psVar7 = (short *)(ppuVar1[lVar12] + lVar6 * 2 + (long)iVar4 * 0x40);
            iVar13 = (iVar9 - iVar4) + 1;
            do {
              if (*psVar7 != 0) {
                iVar10 = (int)lVar6;
                nim->red[0] = iVar10;
                goto LAB_001243d5;
              }
              psVar7 = psVar7 + 0x20;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar12 = lVar12 + 1;
        } while (iVar16 + 1 != (int)lVar12);
      }
      bVar2 = iVar11 < lVar6;
      lVar6 = lVar6 + -1;
    } while (bVar2);
  }
LAB_001243d5:
  iVar5 = (iVar16 - iVar15) * 0x10;
  iVar3 = (iVar9 - iVar4) * 0xc;
  iVar13 = (iVar10 - iVar11) * 8;
  nim->red[1] = iVar13 * iVar13 + iVar5 * iVar5 + iVar3 * iVar3;
  if (iVar16 < iVar15) {
    lVar12 = 0;
  }
  else {
    lVar6 = (long)iVar15;
    lVar12 = 0;
    do {
      if (iVar4 <= iVar9) {
        puVar14 = ppuVar1[lVar6] + (long)iVar4 * 0x40 + (long)iVar11 * 2;
        lVar17 = (long)iVar4;
        do {
          if (iVar11 <= iVar10) {
            lVar8 = 0;
            do {
              lVar12 = (lVar12 + 1) - (ulong)(*(short *)(puVar14 + lVar8 * 2) == 0);
              lVar8 = lVar8 + 1;
            } while ((iVar10 - iVar11) + 1 != (int)lVar8);
          }
          lVar17 = lVar17 + 1;
          puVar14 = puVar14 + 0x40;
        } while (iVar9 + 1 != (int)lVar17);
      }
      lVar6 = lVar6 + 1;
    } while (iVar16 + 1 != (int)lVar6);
  }
  *(long *)(nim->red + 3) = lVar12;
  return;
}

Assistant:

LOCAL (void)
update_box (gdImagePtr oim, gdImagePtr nim, my_cquantize_ptr cquantize, boxptr boxp)
{
	hist3d histogram = cquantize->histogram;
	histptr histp;
	int c0, c1, c2;
	int c0min, c0max, c1min, c1max, c2min, c2max;
	INT32 dist0, dist1, dist2;
	long ccount;
	(void)oim;
	(void)nim;

	c0min = boxp->c0min;
	c0max = boxp->c0max;
	c1min = boxp->c1min;
	c1max = boxp->c1max;
	c2min = boxp->c2min;
	c2max = boxp->c2max;

	if (c0max > c0min)
		for (c0 = c0min; c0 <= c0max; c0++)
			for (c1 = c1min; c1 <= c1max; c1++) {
				histp = &histogram[c0][c1][c2min];
				for (c2 = c2min; c2 <= c2max; c2++)
					if (*histp++ != 0) {
						boxp->c0min = c0min = c0;
						goto have_c0min;
					}
			}
have_c0min:
	if (c0max > c0min)
		for (c0 = c0max; c0 >= c0min; c0--)
			for (c1 = c1min; c1 <= c1max; c1++) {
				histp = &histogram[c0][c1][c2min];
				for (c2 = c2min; c2 <= c2max; c2++)
					if (*histp++ != 0) {
						boxp->c0max = c0max = c0;
						goto have_c0max;
					}
			}
have_c0max:
	if (c1max > c1min)
		for (c1 = c1min; c1 <= c1max; c1++)
			for (c0 = c0min; c0 <= c0max; c0++) {
				histp = &histogram[c0][c1][c2min];
				for (c2 = c2min; c2 <= c2max; c2++)
					if (*histp++ != 0) {
						boxp->c1min = c1min = c1;
						goto have_c1min;
					}
			}
have_c1min:
	if (c1max > c1min)
		for (c1 = c1max; c1 >= c1min; c1--)
			for (c0 = c0min; c0 <= c0max; c0++) {
				histp = &histogram[c0][c1][c2min];
				for (c2 = c2min; c2 <= c2max; c2++)
					if (*histp++ != 0) {
						boxp->c1max = c1max = c1;
						goto have_c1max;
					}
			}
have_c1max:
	if (c2max > c2min)
		for (c2 = c2min; c2 <= c2max; c2++)
			for (c0 = c0min; c0 <= c0max; c0++) {
				histp = &histogram[c0][c1min][c2];
				for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
					if (*histp != 0) {
						boxp->c2min = c2min = c2;
						goto have_c2min;
					}
			}
have_c2min:
	if (c2max > c2min)
		for (c2 = c2max; c2 >= c2min; c2--)
			for (c0 = c0min; c0 <= c0max; c0++) {
				histp = &histogram[c0][c1min][c2];
				for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
					if (*histp != 0) {
						boxp->c2max = c2max = c2;
						goto have_c2max;
					}
			}
have_c2max:

	/* Update box volume.
	 * We use 2-norm rather than real volume here; this biases the method
	 * against making long narrow boxes, and it has the side benefit that
	 * a box is splittable iff norm > 0.
	 * Since the differences are expressed in histogram-cell units,
	 * we have to shift back to JSAMPLE units to get consistent distances;
	 * after which, we scale according to the selected distance scale factors.
	 */
	dist0 = ((c0max - c0min) << C0_SHIFT) * C0_SCALE;
	dist1 = ((c1max - c1min) << C1_SHIFT) * C1_SCALE;
	dist2 = ((c2max - c2min) << C2_SHIFT) * C2_SCALE;
	boxp->volume = dist0 * dist0 + dist1 * dist1 + dist2 * dist2;

	/* Now scan remaining volume of box and compute population */
	ccount = 0;
	for (c0 = c0min; c0 <= c0max; c0++)
		for (c1 = c1min; c1 <= c1max; c1++) {
			histp = &histogram[c0][c1][c2min];
			for (c2 = c2min; c2 <= c2max; c2++, histp++)
				if (*histp != 0) {
					ccount++;
				}
		}
	boxp->colorcount = ccount;
}